

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O0

cmServerResponse * __thiscall
cmServerProtocol1::ProcessConfigure
          (cmServerResponse *__return_storage_ptr__,cmServerProtocol1 *this,cmServerRequest *request
          )

{
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  cmGlobalGenerator *gg_00;
  cmServerRequest *pcVar1;
  bool bVar2;
  int iVar3;
  cmFileMonitor *pcVar4;
  cmake *cm_00;
  ulong uVar5;
  Value *other;
  string *psVar6;
  cmState *pcVar7;
  const_iterator cVar8;
  bool local_611;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_510;
  Value local_4c0;
  anon_class_8_1_8991fb9c local_498;
  Callback local_490;
  string local_470;
  undefined1 local_450 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  toWatchList;
  string local_430;
  int local_410;
  allocator<char> local_409;
  int ret;
  allocator<char> local_3e1;
  string local_3e0;
  allocator<char> local_3b9;
  string local_3b8;
  allocator<char> local_391;
  string local_390;
  byte local_369;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  allocator<char> local_341;
  string local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_320;
  string *cachedGenerator;
  string local_310;
  allocator<char> local_2e9;
  string local_2e8;
  string *local_2c8;
  string *cachedSourceDir;
  string local_2b8;
  cmGlobalGenerator *local_298;
  cmGlobalGenerator *gg;
  string buildDir;
  string sourceDir;
  string local_248;
  cmServerResponse local_228;
  string local_198;
  Value *local_178;
  Value *arg;
  undefined1 local_168;
  undefined1 local_160 [8];
  const_iterator __end4;
  undefined1 local_140 [8];
  const_iterator __begin4;
  Value *__range4;
  undefined1 local_108 [8];
  Value passedArgs;
  bool cacheArgumentsError;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  iterator local_b0;
  size_type local_a8;
  undefined1 local_a0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cacheArgs;
  cmake *cm;
  string errorMessage;
  allocator<char> local_41;
  string local_40;
  cmServerRequest *local_20;
  cmServerRequest *request_local;
  cmServerProtocol1 *this_local;
  
  local_20 = request;
  request_local = (cmServerRequest *)this;
  this_local = (cmServerProtocol1 *)__return_storage_ptr__;
  if (this->m_State == STATE_INACTIVE) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"This instance is inactive.",&local_41);
    cmServerRequest::ReportError(__return_storage_ptr__,request,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    return __return_storage_ptr__;
  }
  pcVar4 = cmServerProtocol::FileMonitor(&this->super_cmServerProtocol);
  cmFileMonitor::StopMonitoring(pcVar4);
  std::__cxx11::string::string((string *)&cm);
  cm_00 = cmServerProtocol::CMakeInstance(&this->super_cmServerProtocol);
  GeneratorInformation::SetupGenerator(&this->GeneratorInfo,cm_00,(string *)&cm);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    cmServerRequest::ReportError(__return_storage_ptr__,local_20,(string *)&cm);
    cacheArgs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    goto LAB_00159295;
  }
  passedArgs.limit_._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"unused",(allocator<char> *)((long)&passedArgs.limit_ + 7));
  passedArgs.limit_._6_1_ = 0;
  local_b0 = &local_d0;
  local_a8 = 1;
  this_00 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&passedArgs.limit_ + 5);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(this_00);
  __l._M_len = local_a8;
  __l._M_array = local_b0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_a0,__l,this_00);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&passedArgs.limit_ + 5));
  local_510 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b0;
  do {
    local_510 = local_510 + -1;
    std::__cxx11::string::~string((string *)local_510);
  } while (local_510 != &local_d0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&passedArgs.limit_ + 7));
  passedArgs.limit_._4_1_ = 0;
  other = Json::Value::operator[](&local_20->Data,&kCACHE_ARGUMENTS_KEY_abi_cxx11_);
  Json::Value::Value((Value *)local_108,other);
  bVar2 = Json::Value::isNull((Value *)local_108);
  if (!bVar2) {
    bVar2 = Json::Value::isString((Value *)local_108);
    if (bVar2) {
      Json::Value::asString_abi_cxx11_((string *)&__range4,(Value *)local_108);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_a0,(value_type *)&__range4);
      std::__cxx11::string::~string((string *)&__range4);
    }
    else {
      bVar2 = Json::Value::isArray((Value *)local_108);
      if (bVar2) {
        __begin4.super_ValueIteratorBase._8_8_ = local_108;
        cVar8 = Json::Value::begin((Value *)__begin4.super_ValueIteratorBase._8_8_);
        __end4.super_ValueIteratorBase._8_8_ = cVar8.super_ValueIteratorBase.current_._M_node;
        __begin4.super_ValueIteratorBase.current_._M_node._0_1_ =
             cVar8.super_ValueIteratorBase.isNull_;
        local_140 = (undefined1  [8])__end4.super_ValueIteratorBase._8_8_;
        cVar8 = Json::Value::end((Value *)__begin4.super_ValueIteratorBase._8_8_);
        arg = (Value *)cVar8.super_ValueIteratorBase.current_._M_node;
        local_168 = cVar8.super_ValueIteratorBase.isNull_;
        local_160 = (undefined1  [8])arg;
        __end4.super_ValueIteratorBase.current_._M_node._0_1_ = local_168;
        while (bVar2 = Json::ValueIteratorBase::operator!=
                                 ((ValueIteratorBase *)local_140,(SelfType *)local_160), bVar2) {
          local_178 = Json::ValueConstIterator::operator*((ValueConstIterator *)local_140);
          bVar2 = Json::Value::isString(local_178);
          if (!bVar2) {
            passedArgs.limit_._4_1_ = 1;
            break;
          }
          Json::Value::asString_abi_cxx11_(&local_198,local_178);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_a0,&local_198);
          std::__cxx11::string::~string((string *)&local_198);
          Json::ValueConstIterator::operator++((ValueConstIterator *)local_140);
        }
      }
      else {
        passedArgs.limit_._4_1_ = 1;
      }
    }
  }
  pcVar1 = local_20;
  if ((passedArgs.limit_._4_1_ & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_248,"cacheArguments must be unset, a string or an array of strings."
               ,(allocator<char> *)(sourceDir.field_2._M_local_buf + 0xf));
    cmServerRequest::ReportError(&local_228,pcVar1,&local_248);
    cmServerResponse::~cmServerResponse(&local_228);
    std::__cxx11::string::~string((string *)&local_248);
    std::allocator<char>::~allocator((allocator<char> *)(sourceDir.field_2._M_local_buf + 0xf));
  }
  psVar6 = cmake::GetHomeDirectory_abi_cxx11_(cm_00);
  std::__cxx11::string::string((string *)(buildDir.field_2._M_local_buf + 8),(string *)psVar6);
  psVar6 = cmake::GetHomeOutputDirectory_abi_cxx11_(cm_00);
  std::__cxx11::string::string((string *)&gg,(string *)psVar6);
  local_298 = cmake::GetGlobalGenerator(cm_00);
  uVar5 = std::__cxx11::string::empty();
  pcVar1 = local_20;
  if ((uVar5 & 1) == 0) {
    bVar2 = cmake::LoadCache(cm_00,(string *)&gg);
    if (bVar2) {
      pcVar7 = cmake::GetState(cm_00);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2e8,"CMAKE_HOME_DIRECTORY",&local_2e9);
      psVar6 = cmState::GetInitializedCacheValue(pcVar7,&local_2e8);
      std::__cxx11::string::~string((string *)&local_2e8);
      std::allocator<char>::~allocator(&local_2e9);
      pcVar1 = local_20;
      local_2c8 = psVar6;
      if (psVar6 == (string *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_310,"No CMAKE_HOME_DIRECTORY found in cache.",
                   (allocator<char> *)((long)&cachedGenerator + 7));
        cmServerRequest::ReportError(__return_storage_ptr__,pcVar1,&local_310);
        std::__cxx11::string::~string((string *)&local_310);
        std::allocator<char>::~allocator((allocator<char> *)((long)&cachedGenerator + 7));
        cacheArgs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
      }
      else {
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) != 0) {
          std::__cxx11::string::operator=
                    ((string *)(buildDir.field_2._M_local_buf + 8),(string *)local_2c8);
          cmake::SetHomeDirectory(cm_00,(string *)((long)&buildDir.field_2 + 8));
        }
        pcVar7 = cmake::GetState(cm_00);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_340,"CMAKE_GENERATOR",&local_341);
        psVar6 = cmState::GetInitializedCacheValue(pcVar7,&local_340);
        std::__cxx11::string::~string((string *)&local_340);
        std::allocator<char>::~allocator(&local_341);
        local_320 = psVar6;
        if (psVar6 != (string *)0x0) {
          local_369 = 0;
          local_611 = false;
          if (local_298 != (cmGlobalGenerator *)0x0) {
            (*local_298->_vptr_cmGlobalGenerator[3])(&local_368);
            local_369 = 1;
            local_611 = std::operator!=(&local_368,local_320);
          }
          if ((local_369 & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_368);
          }
          pcVar1 = local_20;
          if (local_611 != false) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_390,
                       "Configured generator does not match with CMAKE_GENERATOR found in cache.",
                       &local_391);
            cmServerRequest::ReportError(__return_storage_ptr__,pcVar1,&local_390);
            std::__cxx11::string::~string((string *)&local_390);
            std::allocator<char>::~allocator(&local_391);
            cacheArgs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
            goto LAB_00159231;
          }
        }
LAB_00158e03:
        cmSystemTools::ResetErrorOccuredFlag();
        iVar3 = cmake::AddCMakePaths(cm_00);
        pcVar1 = local_20;
        if (iVar3 == 1) {
          bVar2 = cmake::SetCacheArgs(cm_00,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)local_a0);
          pcVar1 = local_20;
          if (bVar2) {
            local_410 = cmake::Configure(cm_00);
            pcVar1 = local_20;
            if (local_410 < 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_430,"Configuration failed.",
                         (allocator<char> *)
                         ((long)&toWatchList.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
              cmServerRequest::ReportError(__return_storage_ptr__,pcVar1,&local_430);
              std::__cxx11::string::~string((string *)&local_430);
              std::allocator<char>::~allocator
                        ((allocator<char> *)
                         ((long)&toWatchList.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
              cacheArgs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
            }
            else {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_450);
              gg_00 = local_298;
              std::__cxx11::string::string((string *)&local_470);
              cmGetCMakeInputs(gg_00,&local_470,(string *)&gg,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)0x0,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)local_450,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)0x0);
              std::__cxx11::string::~string((string *)&local_470);
              pcVar4 = cmServerProtocol::FileMonitor(&this->super_cmServerProtocol);
              local_498.this = this;
              std::function<void(std::__cxx11::string_const&,int,int)>::
              function<cmServerProtocol1::ProcessConfigure(cmServerRequest_const&)::__0,void>
                        ((function<void(std::__cxx11::string_const&,int,int)> *)&local_490,
                         &local_498);
              cmFileMonitor::MonitorPaths
                        (pcVar4,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_450,&local_490);
              std::
              function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int)>
              ::~function(&local_490);
              pcVar1 = local_20;
              this->m_State = STATE_CONFIGURED;
              this->m_isDirty = false;
              Json::Value::Value(&local_4c0,nullValue);
              cmServerRequest::Reply(__return_storage_ptr__,pcVar1,&local_4c0);
              Json::Value::~Value(&local_4c0);
              cacheArgs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_450);
            }
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&ret,"cacheArguments could not be set.",&local_409);
            cmServerRequest::ReportError(__return_storage_ptr__,pcVar1,(string *)&ret);
            std::__cxx11::string::~string((string *)&ret);
            std::allocator<char>::~allocator(&local_409);
            cacheArgs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3e0,"Failed to set CMake paths.",&local_3e1);
          cmServerRequest::ReportError(__return_storage_ptr__,pcVar1,&local_3e0);
          std::__cxx11::string::~string((string *)&local_3e0);
          std::allocator<char>::~allocator(&local_3e1);
          cacheArgs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
        }
      }
    }
    else {
      uVar5 = std::__cxx11::string::empty();
      pcVar1 = local_20;
      if ((uVar5 & 1) == 0) goto LAB_00158e03;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3b8,
                 "No sourceDirectory set via setGlobalSettings and no cache found in buildDirectory."
                 ,&local_3b9);
      cmServerRequest::ReportError(__return_storage_ptr__,pcVar1,&local_3b8);
      std::__cxx11::string::~string((string *)&local_3b8);
      std::allocator<char>::~allocator(&local_3b9);
      cacheArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b8,"No build directory set via Handshake.",
               (allocator<char> *)((long)&cachedSourceDir + 7));
    cmServerRequest::ReportError(__return_storage_ptr__,pcVar1,&local_2b8);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&cachedSourceDir + 7));
    cacheArgs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  }
LAB_00159231:
  std::__cxx11::string::~string((string *)&gg);
  std::__cxx11::string::~string((string *)(buildDir.field_2._M_local_buf + 8));
  Json::Value::~Value((Value *)local_108);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_a0);
LAB_00159295:
  std::__cxx11::string::~string((string *)&cm);
  return __return_storage_ptr__;
}

Assistant:

cmServerResponse cmServerProtocol1::ProcessConfigure(
  const cmServerRequest& request)
{
  if (this->m_State == STATE_INACTIVE) {
    return request.ReportError("This instance is inactive.");
  }

  FileMonitor()->StopMonitoring();

  std::string errorMessage;
  cmake* cm = this->CMakeInstance();
  this->GeneratorInfo.SetupGenerator(cm, &errorMessage);
  if (!errorMessage.empty()) {
    return request.ReportError(errorMessage);
  }

  // Make sure the types of cacheArguments matches (if given):
  std::vector<std::string> cacheArgs = { "unused" };
  bool cacheArgumentsError = false;
  const Json::Value passedArgs = request.Data[kCACHE_ARGUMENTS_KEY];
  if (!passedArgs.isNull()) {
    if (passedArgs.isString()) {
      cacheArgs.push_back(passedArgs.asString());
    } else if (passedArgs.isArray()) {
      for (auto const& arg : passedArgs) {
        if (!arg.isString()) {
          cacheArgumentsError = true;
          break;
        }
        cacheArgs.push_back(arg.asString());
      }
    } else {
      cacheArgumentsError = true;
    }
  }
  if (cacheArgumentsError) {
    request.ReportError(
      "cacheArguments must be unset, a string or an array of strings.");
  }

  std::string sourceDir = cm->GetHomeDirectory();
  const std::string buildDir = cm->GetHomeOutputDirectory();

  cmGlobalGenerator* gg = cm->GetGlobalGenerator();

  if (buildDir.empty()) {
    return request.ReportError("No build directory set via Handshake.");
  }

  if (cm->LoadCache(buildDir)) {
    // build directory has been set up before
    const std::string* cachedSourceDir =
      cm->GetState()->GetInitializedCacheValue("CMAKE_HOME_DIRECTORY");
    if (!cachedSourceDir) {
      return request.ReportError("No CMAKE_HOME_DIRECTORY found in cache.");
    }
    if (sourceDir.empty()) {
      sourceDir = *cachedSourceDir;
      cm->SetHomeDirectory(sourceDir);
    }

    const std::string* cachedGenerator =
      cm->GetState()->GetInitializedCacheValue("CMAKE_GENERATOR");
    if (cachedGenerator) {
      if (gg && gg->GetName() != *cachedGenerator) {
        return request.ReportError("Configured generator does not match with "
                                   "CMAKE_GENERATOR found in cache.");
      }
    }
  } else {
    // build directory has not been set up before
    if (sourceDir.empty()) {
      return request.ReportError("No sourceDirectory set via "
                                 "setGlobalSettings and no cache found in "
                                 "buildDirectory.");
    }
  }

  cmSystemTools::ResetErrorOccuredFlag(); // Reset error state

  if (cm->AddCMakePaths() != 1) {
    return request.ReportError("Failed to set CMake paths.");
  }

  if (!cm->SetCacheArgs(cacheArgs)) {
    return request.ReportError("cacheArguments could not be set.");
  }

  int ret = cm->Configure();
  if (ret < 0) {
    return request.ReportError("Configuration failed.");
  }

  std::vector<std::string> toWatchList;
  cmGetCMakeInputs(gg, std::string(), buildDir, nullptr, &toWatchList,
                   nullptr);

  FileMonitor()->MonitorPaths(toWatchList,
                              [this](const std::string& p, int e, int s) {
                                this->HandleCMakeFileChanges(p, e, s);
                              });

  m_State = STATE_CONFIGURED;
  m_isDirty = false;
  return request.Reply(Json::Value());
}